

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O2

void libtorrent::add_files
               (file_storage *fs,string *file,
               function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *p,create_flags_t flags)

{
  undefined4 in_register_0000000c;
  string_view f;
  string sStack_88;
  string local_68;
  string local_48;
  
  f._M_str._4_4_ = in_register_0000000c;
  f._M_str._0_4_ = flags.m_val;
  f._M_len = (size_t)(file->_M_dataplus)._M_p;
  complete_abi_cxx11_(&local_48,(libtorrent *)file->_M_string_length,f);
  parent_path(&local_68,&local_48);
  filename(&sStack_88,file);
  anon_unknown_40::add_files_impl(fs,&local_68,&sStack_88,p,flags);
  ::std::__cxx11::string::~string((string *)&sStack_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void add_files(file_storage& fs, std::string const& file
		, std::function<bool(std::string)> p, create_flags_t const flags)
	{
		add_files_impl(fs, parent_path(complete(file)), filename(file), p, flags);
	}